

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voice.h
# Opt level: O3

void __thiscall Voice::~Voice(Voice *this)

{
  __pointer_type ptr;
  pointer ptr_00;
  
  LOCK();
  ptr = (this->mUpdate)._M_b._M_p;
  (this->mUpdate)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  al_free(ptr);
  ptr_00 = (this->mChans).
           super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ptr_00 != (pointer)0x0) {
    al_free(ptr_00);
    return;
  }
  return;
}

Assistant:

~Voice() { delete mUpdate.exchange(nullptr, std::memory_order_acq_rel); }